

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O1

TIntermSymbol * __thiscall
glslang::TIntermediate::addSymbol
          (TIntermediate *this,longlong id,TString *name,TString *mangledName,TType *type,
          TConstUnionArray *constArray,TIntermTyped *constSubtree,TSourceLoc *loc)

{
  TPoolAllocator *this_00;
  TIntermSymbol *this_01;
  
  this_00 = GetThreadPoolAllocator();
  this_01 = (TIntermSymbol *)TPoolAllocator::allocate(this_00,0x138);
  TIntermSymbol::TIntermSymbol(this_01,id,name,this->language,type,mangledName);
  (*(this_01->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[1])(this_01,loc);
  (this_01->constArray).unionArray = constArray->unionArray;
  this_01->constSubtree = constSubtree;
  return this_01;
}

Assistant:

TIntermSymbol* TIntermediate::addSymbol(long long id, const TString& name, const TString& mangledName, const TType& type, const TConstUnionArray& constArray,
                                        TIntermTyped* constSubtree, const TSourceLoc& loc)
{
    TIntermSymbol* node = new TIntermSymbol(id, name, getStage(), type, &mangledName);
    node->setLoc(loc);
    node->setConstArray(constArray);
    node->setConstSubtree(constSubtree);

    return node;
}